

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfm.cpp
# Opt level: O2

Ref<embree::Image> __thiscall embree::loadPFM(embree *this,FileName *fileName)

{
  bool bVar1;
  ImageT<embree::Col4<float>_> *this_00;
  runtime_error *prVar2;
  size_t width_00;
  ssize_t x;
  size_t height_00;
  long lVar3;
  long lVar4;
  char cty [2];
  int height;
  int width;
  float maxColor;
  undefined1 local_2c8 [16];
  Image *local_2b0;
  float rgb [3];
  undefined1 local_298 [8];
  float fStack_290;
  undefined4 uStack_28c;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  string type;
  fstream file;
  
  std::fstream::fstream(&file);
  std::ios::exceptions((int)&file + (int)*(undefined8 *)(_file + -0x18));
  std::fstream::open((char *)&file,(_Ios_Openmode)(fileName->filename)._M_dataplus._M_p);
  std::istream::read((char *)&file,(long)cty);
  skipSpacesAndComments(&file);
  type._M_dataplus._M_p = (pointer)&type.field_2;
  type.field_2._0_1_ = cty[0];
  type.field_2._1_1_ = cty[1];
  type._M_string_length = 2;
  type.field_2._M_local_buf[2] = '\0';
  std::istream::operator>>((istream *)&file,&width);
  skipSpacesAndComments(&file);
  std::istream::operator>>((istream *)&file,&height);
  skipSpacesAndComments(&file);
  std::istream::_M_extract<float>((float *)&file);
  local_2c8._0_4_ = maxColor;
  if (0.0 < maxColor) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"Big endian PFM files not supported");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::istream::ignore();
  this_00 = (ImageT<embree::Col4<float>_> *)::operator_new(0x48);
  width_00 = (size_t)width;
  height_00 = (size_t)height;
  std::__cxx11::string::string((string *)local_298,(string *)fileName);
  ImageT<embree::Col4<float>_>::ImageT(this_00,width_00,height_00,(string *)local_298);
  *(ImageT<embree::Col4<float>_> **)this = this_00;
  (*(this_00->super_Image).super_RefCount._vptr_RefCount[2])(this_00);
  local_2b0 = (Image *)this;
  std::__cxx11::string::~string((string *)local_298);
  bVar1 = std::operator==(&type,"PF");
  if (!bVar1) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"Invalid magic value in PFM file");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_278 = -1.0 / (float)local_2c8._0_4_;
  lVar4 = (long)height;
  local_2c8 = ZEXT416((uint)local_278);
  fStack_274 = local_278;
  fStack_270 = local_278;
  fStack_26c = local_278;
  while (lVar4 = lVar4 + -1, -1 < lVar4) {
    for (lVar3 = 0; lVar3 < width; lVar3 = lVar3 + 1) {
      std::istream::read((char *)&file,(long)rgb);
      local_298._0_4_ = rgb[0] * (float)local_2c8._0_4_;
      local_298._4_4_ = (float)rgb._4_8_ * local_278;
      fStack_290 = SUB84(rgb._4_8_,4) * fStack_274;
      uStack_28c = 0x3f800000;
      (*(this_00->super_Image).super_RefCount._vptr_RefCount[5])(this_00,lVar3,lVar4,local_298);
    }
  }
  std::__cxx11::string::~string((string *)&type);
  std::fstream::~fstream(&file);
  return (Ref<embree::Image>)local_2b0;
}

Assistant:

Ref<Image> loadPFM(const FileName& fileName)
  {
    /* open file for reading */
    std::fstream file;
    file.exceptions (std::fstream::failbit | std::fstream::badbit);
    file.open (fileName.c_str(), std::fstream::in | std::fstream::binary);

    /* read file type */
    char cty[2]; file.read(cty,2);
    skipSpacesAndComments(file);
    std::string type(cty,2);

    /* read width, height, and maximum color value */
    int width; file >> width;
    skipSpacesAndComments(file);
    int height; file >> height;
    skipSpacesAndComments(file);
    float maxColor; file >> maxColor;
    if (maxColor > 0) THROW_RUNTIME_ERROR("Big endian PFM files not supported");
    float rcpMaxColor = -1.0f/float(maxColor);
    file.ignore(); // skip space or return

    /* create image and fill with data */
    Ref<Image> img = new Image4f(width,height,fileName);

    /* image in binary format 16 bit */
    if (type == "PF")
    {
      float rgb[3];
      for (ssize_t y=height-1; y>=0; y--) {
        for (ssize_t x=0; x<width; x++) {
          file.read((char*)rgb,sizeof(rgb));
          img->set(x,y,Color4(rgb[0]*rcpMaxColor,rgb[1]*rcpMaxColor,rgb[2]*rcpMaxColor,1.0f));
        }
      }
    }

    /* invalid magic value */
    else {
      THROW_RUNTIME_ERROR("Invalid magic value in PFM file");
    }
    return img;
  }